

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

void __thiscall
cmdline::parser::option_without_value::~option_without_value(option_without_value *this)

{
  (this->super_option_base)._vptr_option_base = (_func_int **)&PTR__option_without_value_00149738;
  std::__cxx11::string::~string((string *)&this->desc);
  std::__cxx11::string::~string((string *)&this->nam);
  return;
}

Assistant:

~option_without_value(){}